

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

string * cmdline::detail::readable_typename<unsigned_long>(void)

{
  string *in_RDI;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,_is_equal + (*_is_equal == '*'),&local_31);
  demangle(in_RDI,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

std::string readable_typename()
{
  return demangle(typeid(T).name());
}